

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntt.cpp
# Opt level: O0

void ntt(int k,vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *v,bool inv)

{
  value_type vVar1;
  value_type vVar2;
  size_type sVar3;
  reference pvVar4;
  pointer *local_90;
  int local_7c;
  ulong uStack_78;
  int i_1;
  ull omega;
  ull omega1;
  int local_54;
  undefined1 local_50 [4];
  int i;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> odd;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> even;
  bool inv_local;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *v_local;
  int k_local;
  
  if (k != 0) {
    std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::vector
              ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
               &odd.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::vector
              ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)local_50);
    for (local_54 = 0;
        sVar3 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::size(v),
        (ulong)(long)local_54 < sVar3; local_54 = local_54 + 1) {
      if (local_54 % 2 == 0) {
        local_90 = &odd.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
      }
      else {
        local_90 = (pointer *)local_50;
      }
      pvVar4 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                         (v,(long)local_54);
      std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::push_back
                ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)local_90,pvVar4)
      ;
    }
    ntt(k + -1,(vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
               &odd.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,inv);
    ntt(k + -1,(vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)local_50,inv);
    pvVar4 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                       (&w,(long)k);
    omega = *pvVar4;
    if (inv) {
      pvVar4 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                         (&wInv,(long)k);
      omega = *pvVar4;
    }
    uStack_78 = 1;
    for (local_7c = 0; local_7c < 1 << ((char)k - 1U & 0x1f); local_7c = local_7c + 1) {
      pvVar4 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                         ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                          &odd.
                           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_7c);
      vVar1 = *pvVar4;
      pvVar4 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                         ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                          local_50,(long)local_7c);
      vVar2 = *pvVar4;
      pvVar4 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                         (v,(long)local_7c);
      *pvVar4 = (vVar1 + (uStack_78 * vVar2) % 0xc0000001) % 0xc0000001;
      pvVar4 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                         ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                          &odd.
                           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_7c);
      vVar1 = *pvVar4;
      pvVar4 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                         ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                          local_50,(long)local_7c);
      vVar2 = *pvVar4;
      pvVar4 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                         (v,(long)(local_7c + (1 << ((char)k - 1U & 0x1f))));
      *pvVar4 = ((vVar1 + 0xc0000001) - (uStack_78 * vVar2) % 0xc0000001) % 0xc0000001;
      uStack_78 = (omega * uStack_78) % 0xc0000001;
    }
    std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~vector
              ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)local_50);
    std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~vector
              ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
               &odd.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  return;
}

Assistant:

void ntt(int k, vector<ull>& v, bool inv) { // n = 2^k
    if (!k) return;
    vector<ull> even, odd;
    rep(i, 0, v.size()) ((i % 2) ? odd : even).push_back(v[i]);
    ntt(k - 1, even, inv);
    ntt(k - 1, odd, inv);
    // (2^k)-th root of unity: omega1^(2^k) = 1 (mod P here)
    ull omega1 = w[k];
    if (inv) omega1 = wInv[k];
    ull omega = 1;
    rep(i, 0, (1 << (k - 1))) {
        v[i] = (even[i] + (omega * odd[i]) % P) % P;
        v[i + (1 << (k - 1))] = (P + even[i] - (omega * odd[i]) % P) % P;
        omega = (omega1 * omega) % P;
    }
}